

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::leaf_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
          (ref<immutable::rrb_details::leaf_node<char,_false>_> *this,
          ref<immutable::rrb_details::leaf_node<char,_false>_> *r)

{
  leaf_node<char,_false> *plVar1;
  leaf_node<char,_false> *p_node;
  
  plVar1 = r->ptr;
  if (plVar1 != (leaf_node<char,_false> *)0x0) {
    plVar1->_ref_count = plVar1->_ref_count + 1;
  }
  p_node = this->ptr;
  this->ptr = plVar1;
  rrb_details::release<char>(p_node);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }